

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcessOutput.cxx
# Opt level: O0

Encoding cmProcessOutput::FindEncoding(string *name)

{
  bool bVar1;
  Encoding local_14;
  Encoding encoding;
  string *name_local;
  
  local_14 = Auto;
  bVar1 = std::operator==(name,"UTF8");
  if ((bVar1) || (bVar1 = std::operator==(name,"UTF-8"), bVar1)) {
    local_14 = UTF8;
  }
  else {
    bVar1 = std::operator==(name,"NONE");
    if (bVar1) {
      local_14 = None;
    }
    else {
      bVar1 = std::operator==(name,"ANSI");
      if (bVar1) {
        local_14 = ANSI;
      }
      else {
        bVar1 = std::operator==(name,"OEM");
        if (bVar1) {
          local_14 = OEM;
        }
      }
    }
  }
  return local_14;
}

Assistant:

cmProcessOutput::Encoding cmProcessOutput::FindEncoding(
  std::string const& name)
{
  Encoding encoding = Auto;
  if ((name == "UTF8") || (name == "UTF-8")) {
    encoding = UTF8;
  } else if (name == "NONE") {
    encoding = None;
  } else if (name == "ANSI") {
    encoding = ANSI;
  } else if (name == "OEM") {
    encoding = OEM;
  }
  return encoding;
}